

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::ScopedPrematureExitFile::ScopedPrematureExitFile
          (ScopedPrematureExitFile *this,char *premature_exit_filepath)

{
  FILE *__stream;
  allocator<char> local_11;
  
  if (premature_exit_filepath == (char *)0x0) {
    premature_exit_filepath = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,premature_exit_filepath,&local_11);
  if ((this->premature_exit_filepath_)._M_string_length != 0) {
    __stream = fopen((this->premature_exit_filepath_)._M_dataplus._M_p,"w");
    fputc(0x30,__stream);
    fclose(__stream);
  }
  return;
}

Assistant:

explicit ScopedPrematureExitFile(const char* premature_exit_filepath)
      : premature_exit_filepath_(premature_exit_filepath ?
                                 premature_exit_filepath : "") {
    // If a path to the premature-exit file is specified...
    if (!premature_exit_filepath_.empty()) {
      // create the file with a single "0" character in it.  I/O
      // errors are ignored as there's nothing better we can do and we
      // don't want to fail the test because of this.
      FILE* pfile = posix::FOpen(premature_exit_filepath_.c_str(), "w");
      fwrite("0", 1, 1, pfile);
      fclose(pfile);
    }
  }